

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaEmbed.c
# Opt level: O0

void Emb_ManCollectSuper(Gia_Man_t *p,Gia_Obj_t *pObj,Vec_Int_t *vSuper,Vec_Int_t *vVisit)

{
  int iVar1;
  Gia_Obj_t *pGVar2;
  int local_30;
  int i;
  int Entry;
  Vec_Int_t *vVisit_local;
  Vec_Int_t *vSuper_local;
  Gia_Obj_t *pObj_local;
  Gia_Man_t *p_local;
  
  Vec_IntClear(vSuper);
  Vec_IntClear(vVisit);
  if (((uint)(*(ulong *)pObj >> 0x1e) & 1) != 1) {
    __assert_fail("pObj->fMark0 == 1",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/giaEmbed.c"
                  ,0x13d,
                  "void Emb_ManCollectSuper(Gia_Man_t *, Gia_Obj_t *, Vec_Int_t *, Vec_Int_t *)");
  }
  *(ulong *)pObj = *(ulong *)pObj & 0xffffffffbfffffff;
  Emb_ManCollectSuper_rec(p,pObj,vSuper,vVisit);
  *(ulong *)pObj = *(ulong *)pObj & 0xffffffffbfffffff | 0x40000000;
  for (local_30 = 0; iVar1 = Vec_IntSize(vVisit), local_30 < iVar1; local_30 = local_30 + 1) {
    iVar1 = Vec_IntEntry(vVisit,local_30);
    pGVar2 = Gia_ManObj(p,iVar1);
    *(ulong *)pGVar2 = *(ulong *)pGVar2 & 0xbfffffffffffffff;
  }
  return;
}

Assistant:

void Emb_ManCollectSuper( Gia_Man_t * p, Gia_Obj_t * pObj, Vec_Int_t * vSuper, Vec_Int_t * vVisit )  
{
    int Entry, i;
    Vec_IntClear( vSuper );
    Vec_IntClear( vVisit );
    assert( pObj->fMark0 == 1 );
    pObj->fMark0 = 0;
    Emb_ManCollectSuper_rec( p, pObj, vSuper, vVisit );
    pObj->fMark0 = 1;
    Vec_IntForEachEntry( vVisit, Entry, i )
        Gia_ManObj(p, Entry)->fMark1 = 0;
}